

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O0

int find_sender(node_info *info,int num_proc,int recv_node,int tile,int display_node,int num_tiles,
               IceTBoolean *all_contained_tmasks)

{
  int local_34;
  int local_30;
  int sender;
  int send_node;
  int num_tiles_local;
  int display_node_local;
  int tile_local;
  int recv_node_local;
  int num_proc_local;
  node_info *info_local;
  
  local_34 = -1;
  local_30 = num_proc + -1;
  do {
    if (local_30 < 0) {
LAB_00121b35:
      if (local_34 < 0) {
        info_local._4_4_ = 0;
      }
      else {
        info[recv_node].tile_held = tile;
        info[recv_node].tile_receiving = tile;
        info[recv_node].recv_src = info[local_34].rank;
        info[local_34].tile_sending = tile;
        info[local_34].send_dest = info[recv_node].rank;
        if (info[local_34].tile_held == tile) {
          info[local_34].tile_held = -1;
        }
        info[local_34].num_contained = info[local_34].num_contained + -1;
        all_contained_tmasks[info[local_34].rank * num_tiles + tile] = '\0';
        info_local._4_4_ = 1;
      }
      return info_local._4_4_;
    }
    if ((((info[local_30].tile_sending < 0) &&
         (all_contained_tmasks[info[local_30].rank * num_tiles + tile] != '\0')) &&
        (info[local_30].tile_receiving != tile)) &&
       ((info[local_30].rank != display_node && (local_30 != recv_node)))) {
      if (info[local_30].tile_held == tile) {
        local_34 = local_30;
        goto LAB_00121b35;
      }
      if (local_34 < 0) {
        local_34 = local_30;
      }
    }
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

static int find_sender(struct node_info *info, int num_proc,
                       int recv_node, int tile,
                       int display_node, int num_tiles,
                       IceTBoolean *all_contained_tmasks)
{
    int send_node;
    int sender = -1;

    for (send_node = num_proc-1; send_node >= 0; send_node--) {
        if (   (info[send_node].tile_sending >= 0)
            || !CONTAINS_TILE(send_node, tile)
            || (info[send_node].tile_receiving == tile)
            || (info[send_node].rank == display_node)
            || (send_node == recv_node) ) {
            continue;
        }
        if (info[send_node].tile_held == tile) {
          /* Favor sending held images. */
            sender = send_node;
            break;
        } else if (sender < 0) {
            sender = send_node;
        }
    }
    
    if (sender >= 0) {
        info[recv_node].tile_held = tile;
        info[recv_node].tile_receiving = tile;
        info[recv_node].recv_src = info[sender].rank;
        info[sender].tile_sending = tile;
        info[sender].send_dest = info[recv_node].rank;
        if (info[sender].tile_held == tile) info[sender].tile_held = -1;
        info[sender].num_contained--;
        all_contained_tmasks[info[sender].rank*num_tiles + tile] = 0;
        return 1;
    } else {
        return 0;
    }
}